

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

bool __thiscall polyscope::TransformationGizmo::interact(TransformationGizmo *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  TransformHandle TVar4;
  mat4 *pmVar5;
  float fVar6;
  undefined1 auVar7 [16];
  vec2 screenCoords;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vec3 normal_00;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar13;
  vec4 vVar14;
  bool bVar15;
  ImGuiIO *pIVar16;
  vec<3,_float,_(glm::qualifier)0> *v;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar17;
  TransformationGizmo *this_00;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  vec<3,_float,_(glm::qualifier)0> *v1;
  float fVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar37;
  undefined1 auVar38 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  vec3 raySource;
  vec3 rayDir;
  vec<3,_float,_(glm::qualifier)0> vVar39;
  col_type cVar40;
  col_type cVar41;
  vec3 normal_01;
  vec3 tangent;
  vec3 tangent_00;
  float local_1cc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c8;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_1c4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_198;
  undefined1 local_178 [16];
  vec4 trans_1;
  float fStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  _Alloc_hider _Stack_120;
  size_type sStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  vec3 normal;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *local_f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e8 [4];
  _Alloc_hider local_d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d0;
  vec4 trans;
  vec<3,_float,_(glm::qualifier)0> local_b0;
  vec<3,_float,_(glm::qualifier)0> local_a0;
  vec<3,_float,_(glm::qualifier)0> local_90;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec3 nearestPoint;
  undefined1 extraout_var [60];
  
  if ((this->enabled).value != true) {
    return false;
  }
  pIVar16 = ImGui::GetIO();
  bVar3 = this->currentlyDragging;
  if ((bVar3 == true) &&
     ((bVar15 = ImGui::IsMouseDown(0), !bVar15 ||
      (bVar15 = ImGui::IsMousePosValid((ImVec2 *)0x0), !bVar15)))) {
    this->currentlyDragging = false;
  }
  raySource = view::getCameraWorldPosition();
  screenCoords.field_0 =
       (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)(pIVar16->MousePos).x;
  screenCoords.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)(pIVar16->MousePos).y;
  rayDir = view::screenCoordsToWorldRay(screenCoords);
  uVar37 = 0x3f80000000000000;
  trans_1 = (vec4)(ZEXT816(0x3f80000000000000) << 0x40);
  cVar40 = glm::operator*(this->T,&trans_1);
  uVar23 = cVar40._0_8_;
  auVar38 = (undefined1  [56])0x0;
  trans_1 = SUB6416(ZEXT464(0x3f800000),0);
  cVar41 = glm::operator*(this->T,&trans_1);
  auVar27._0_8_ = cVar41._0_8_;
  auVar27._8_56_ = auVar38;
  local_80._0_8_ = vmovlps_avx(auVar27._0_16_);
  auVar38 = ZEXT856(0);
  local_80.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar41.field_2;
  trans_1 = (vec4)ZEXT816(0x3f80000000000000);
  cVar41 = glm::operator*(this->T,&trans_1);
  auVar28._0_8_ = cVar41._0_8_;
  auVar28._8_56_ = auVar38;
  local_90._0_8_ = vmovlps_avx(auVar28._0_16_);
  auVar38 = ZEXT856(0x3f800000);
  local_90.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar41.field_2;
  trans_1 = (vec4)(ZEXT816(0x3f800000) << 0x40);
  this_00 = (TransformationGizmo *)&trans_1;
  cVar41 = glm::operator*(this->T,(row_type *)this_00);
  auVar29._0_8_ = cVar41._0_8_;
  auVar29._8_56_ = auVar38;
  local_a0._0_8_ = vmovlps_avx(auVar29._0_16_);
  local_a0.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar41.field_2;
  vVar39 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_80);
  local_e8[0] = vVar39.field_2;
  auVar30._0_8_ = vVar39._0_8_;
  auVar30._8_56_ = auVar38;
  local_f0 = (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)
             vmovlps_avx(auVar30._0_16_);
  vVar39 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_90);
  local_e8[3] = vVar39.field_2;
  auVar31._0_8_ = vVar39._0_8_;
  auVar31._8_56_ = auVar38;
  local_e8._4_8_ = vmovlps_avx(auVar31._0_16_);
  vVar39 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_a0);
  vVar14 = trans_1;
  local_d0 = vVar39.field_2;
  auVar32._0_8_ = vVar39._0_8_;
  auVar32._8_56_ = auVar38;
  local_d8._M_p = (pointer)vmovlps_avx(auVar32._0_16_);
  pmVar5 = this->T;
  uVar10 = pmVar5->value[0].field_0;
  uVar11 = pmVar5->value[0].field_1;
  uVar12 = pmVar5->value[0].field_2;
  trans_1.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)uVar12;
  trans_1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uVar11;
  trans_1.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uVar10;
  trans_1.field_3 = vVar14.field_3;
  fVar22 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call
                     ((vec<3,_float,_(glm::qualifier)0> *)&trans_1);
  fVar6 = fVar22 * this->gizmoSizeRel * state::lengthScale;
  fVar22 = fVar6 * this->diskWidthObj;
  local_198 = cVar40.field_2;
  if (this->currentlyDragging == false) {
    local_178._0_12_ = ZEXT812(0);
    local_178._12_4_ = 0;
    uVar19 = 0xffffffffffffffff;
    paVar17 = local_e8;
    iVar20 = 0;
    local_1c4.w = INFINITY;
    local_1cc = INFINITY;
    local_1c8.z = 0.0;
    for (uVar21 = 0; uVar21 != 3; uVar21 = uVar21 + 1) {
      normal_01.field_2 = *paVar17;
      normal_01._0_8_ = *(undefined8 *)(paVar17 + -2);
      circleTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
                 raySource,rayDir,cVar40._0_12_,normal_01,fVar6 - fVar22);
      vVar14 = trans_1;
      if ((trans_1.field_3.w < fVar22) && (fStack_138 < local_1cc)) {
        local_178._8_8_ = 0;
        local_178._0_4_ = trans_1.field_0;
        local_178._4_4_ = trans_1.field_1;
        local_1c8.z = trans_1.field_2.z;
        iVar20 = 1;
        uVar19 = uVar21 & 0xffffffff;
        local_1c4 = trans_1.field_3;
        local_1cc = fStack_138;
      }
      paVar17 = paVar17 + 3;
      trans_1 = vVar14;
    }
    paVar17 = local_e8;
    for (uVar21 = 0; iVar18 = (int)uVar19, uVar21 != 3; uVar21 = uVar21 + 1) {
      tangent.field_2 = *paVar17;
      tangent._0_8_ = *(undefined8 *)(paVar17 + -2);
      lineTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
               raySource,rayDir,cVar40._0_12_,tangent,fVar6 * this->vecLength);
      vVar14 = trans_1;
      if ((trans_1.field_3.w < fVar22) && (fStack_138 - fVar22 < local_1cc)) {
        local_178._8_8_ = 0;
        local_178._0_4_ = trans_1.field_0;
        local_178._4_4_ = trans_1.field_1;
        local_1c8.z = trans_1.field_2.z;
        iVar20 = 2;
        uVar19 = uVar21 & 0xffffffff;
        local_1c4 = trans_1.field_3;
        local_1cc = fStack_138 - fVar22;
      }
      paVar17 = paVar17 + 3;
      trans_1 = vVar14;
    }
    sphereTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
               raySource,rayDir,cVar40._0_12_,fVar6 * this->sphereRad,true);
    vVar14 = trans_1;
    if (((trans_1.field_3.w == 0.0) && (!NAN(trans_1.field_3.w))) && (fStack_138 < local_1cc)) {
      iVar18 = 0;
      local_178._8_8_ = 0;
      local_178._0_4_ = trans_1.field_0;
      local_178._4_4_ = trans_1.field_1;
      trans_1.field_2 = vVar14.field_2;
      local_1c8.z = trans_1.field_2.z;
      iVar20 = 3;
      local_1c4 = trans_1.field_3;
    }
    this->selectedDim = -1;
    this->selectedType = None;
    trans_1 = vVar14;
    if ((iVar20 == 1) && (local_1c4.w < fVar22)) {
      this->selectedType = Rotation;
      this->selectedDim = iVar18;
      bVar15 = ImGui::IsMouseClicked(0,false);
      auVar7._8_8_ = uVar37;
      auVar7._0_8_ = uVar23;
      if ((bVar15) && (pIVar16->WantCaptureMouse == false)) {
        this->currentlyDragging = true;
        auVar7 = vsubps_avx(local_178,auVar7);
        auVar38 = ZEXT856(auVar7._8_8_);
        uVar23 = vmovlps_avx(auVar7);
        trans_1.field_2.z = local_1c8.z - local_198.z;
        trans_1.field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar23;
        trans_1.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar23 >> 0x20);
        vVar39 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                           ((vec<3,_float,_(glm::qualifier)0> *)&trans_1);
        auVar36._0_8_ = vVar39._0_8_;
        auVar36._8_56_ = auVar38;
        uVar23 = vmovlps_avx(auVar36._0_16_);
        (this->dragPrevVec).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar23;
        (this->dragPrevVec).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar23 >> 0x20);
        (this->dragPrevVec).field_2 = vVar39.field_2;
      }
      goto LAB_001fce46;
    }
    if ((iVar20 != 2) || (fVar22 <= local_1c4.w)) {
      if (iVar20 != 3) goto LAB_001fce46;
      this->selectedType = Scale;
    }
    else {
      this->selectedType = Translation;
      this->selectedDim = iVar18;
    }
    bVar15 = ImGui::IsMouseClicked(0,false);
    if ((!bVar15) || (pIVar16->WantCaptureMouse != false)) goto LAB_001fce46;
    this->currentlyDragging = true;
    uVar23 = vmovlps_avx(local_178);
    (this->dragPrevVec).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar23;
    (this->dragPrevVec).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         (int)((ulong)uVar23 >> 0x20);
  }
  else {
    TVar4 = this->selectedType;
    if (TVar4 != Scale) {
      if (TVar4 == Translation) {
        tangent_00.field_2 = local_e8[(long)this->selectedDim * 3];
        tangent_00._0_8_ = *(undefined8 *)((long)&local_f0 + (long)this->selectedDim * 0xc);
        lineTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
                 raySource,rayDir,cVar40._0_12_,tangent_00,INFINITY);
        vVar14 = trans_1;
        uVar23 = 0;
        nearestPoint.field_0.x = trans_1.field_0.x;
        nearestPoint.field_1.y = trans_1.field_1.y;
        trans_1.field_2 = vVar14.field_2;
        nearestPoint.field_2.z = trans_1.field_2.z;
        if (INFINITY <= trans_1.field_3.w) goto LAB_001fce46;
        v1 = &nearestPoint;
        trans_1 = vVar14;
        vVar39 = glm::operator-(v1,&this->dragPrevVec);
        pmVar5 = this->T;
        uVar1 = pmVar5->value[3].field_0;
        uVar2 = pmVar5->value[3].field_1;
        auVar25._0_4_ = (float)uVar1 + vVar39.field_0.x;
        auVar25._4_4_ = (float)uVar2 + vVar39.field_1.y;
        auVar25._8_4_ = (float)uVar23 + 0.0;
        auVar25._12_4_ = (float)((ulong)uVar23 >> 0x20) + 0.0;
        uVar23 = vmovlps_avx(auVar25);
        pmVar5->value[3].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar23;
        pmVar5->value[3].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar23 >> 0x20);
        pmVar5->value[3].field_2.z = vVar39.field_2.z + pmVar5->value[3].field_2.z;
      }
      else {
        if (TVar4 != Rotation) goto LAB_001fce46;
        normal.field_2 = local_e8[(long)this->selectedDim * 3];
        normal._0_8_ = *(undefined8 *)((long)&local_f0 + (long)this->selectedDim * 0xc);
        normal_00.field_2 = normal.field_2;
        normal_00.field_0 = normal.field_0;
        normal_00.field_1 = normal.field_1;
        circleTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
                   raySource,rayDir,cVar40._0_12_,normal_00,fVar6 - fVar22);
        vVar14 = trans_1;
        if (INFINITY <= trans_1.field_3.w) goto LAB_001fce46;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = trans_1.field_0;
        auVar24._4_4_ = trans_1.field_1;
        trans_1.field_2 = vVar14.field_2;
        auVar8._8_8_ = uVar37;
        auVar8._0_8_ = uVar23;
        auVar7 = vsubps_avx(auVar24,auVar8);
        auVar38 = ZEXT856(auVar7._8_8_);
        uVar23 = vmovlps_avx(auVar7);
        trans_1.field_2.z = trans_1.field_2.z - local_198.z;
        trans_1.field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar23;
        trans_1.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar23 >> 0x20);
        vVar39 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                           ((vec<3,_float,_(glm::qualifier)0> *)&trans_1);
        local_b0.field_2 = vVar39.field_2;
        auVar33._0_8_ = vVar39._0_8_;
        auVar33._8_56_ = auVar38;
        v1 = &local_b0;
        local_b0._0_8_ = vmovlps_avx(auVar33._0_16_);
        vVar39 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                           (&this->dragPrevVec,v1);
        auVar34._0_8_ = vVar39._0_8_;
        auVar34._8_56_ = auVar38;
        uVar23 = vmovlps_avx(auVar34._0_16_);
        trans_1.field_2.z = vVar39.field_2;
        trans_1.field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar23;
        trans_1.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar23 >> 0x20);
        auVar35._0_4_ =
             glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                       (&normal,(vec<3,_float,_(glm::qualifier)0> *)&trans_1);
        auVar35._4_60_ = extraout_var;
        auVar7 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),auVar35._0_16_);
        auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
        fVar22 = asinf(auVar7._0_4_);
        pmVar5 = this->T;
        trans.field_0 = pmVar5->value[3].field_0;
        trans.field_1 = pmVar5->value[3].field_1;
        trans.field_2 = pmVar5->value[3].field_2;
        trans.field_3 = pmVar5->value[3].field_3;
        pmVar5->value[3].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
        pmVar5->value[3].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
        pmVar5->value[3].field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
        pmVar5->value[3].field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
        glm::rotate<float,(glm::qualifier)0>
                  ((mat<4,_4,_float,_(glm::qualifier)0> *)&nearestPoint,(glm *)&normal,fVar22,v);
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&trans_1,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&nearestPoint,this->T);
        vVar14 = trans_1;
        pmVar5 = this->T;
        pmVar5->value[0].field_0 = trans_1.field_0;
        pmVar5->value[0].field_1 = trans_1.field_1;
        pmVar5->value[0].field_2 = trans_1.field_2;
        pmVar5->value[0].field_3 = trans_1.field_3;
        pmVar5->value[1].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)fStack_138;
        pmVar5->value[1].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uStack_134;
        pmVar5->value[1].field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)uStack_130;
        pmVar5->value[1].field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_12c;
        pmVar5->value[2].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uStack_128;
        pmVar5->value[2].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uStack_124;
        *(pointer *)&pmVar5->value[2].field_2 = _Stack_120._M_p;
        pmVar5->value[3].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)sStack_118;
        pmVar5->value[3].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)sStack_118._4_4_;
        pmVar5->value[3].field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
             aStack_110._M_allocated_capacity._0_4_;
        pmVar5->value[3].field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
             aStack_110._M_allocated_capacity._4_4_;
        pmVar5 = this->T;
        pmVar5->value[3].field_0 = trans.field_0;
        pmVar5->value[3].field_1 = trans.field_1;
        pmVar5->value[3].field_2 = trans.field_2;
        pmVar5->value[3].field_3 = trans.field_3;
        trans_1 = vVar14;
      }
      markUpdated(this);
      requestRedraw();
      (this->dragPrevVec).field_2 = v1->field_2;
      aVar13 = v1->field_1;
      (this->dragPrevVec).field_0 = v1->field_0;
      (this->dragPrevVec).field_1 = aVar13;
      goto LAB_001fce46;
    }
    fVar6 = fVar6 * this->sphereRad;
    sphereTest((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)&trans_1,this_00,
               raySource,rayDir,cVar40._0_12_,fVar6,false);
    auVar9._8_8_ = uVar37;
    auVar9._0_8_ = uVar23;
    if (INFINITY <= trans_1.field_3.w) goto LAB_001fce46;
    local_1c8.z = trans_1.field_2.z;
    auVar26._8_8_ = 0;
    auVar26._0_4_ = trans_1.field_0;
    auVar26._4_4_ = trans_1.field_1;
    auVar7 = vsubps_avx(auVar26,auVar9);
    uVar23 = vmovlps_avx(auVar7);
    trans_1.field_2.z = trans_1.field_2.z - local_198.z;
    trans_1.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar23;
    trans_1.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         (int)((ulong)uVar23 >> 0x20);
    fVar22 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call
                       ((vec<3,_float,_(glm::qualifier)0> *)&trans_1);
    pmVar5 = this->T;
    trans_1 = pmVar5->value[3];
    pmVar5->value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    pmVar5->value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    pmVar5->value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    pmVar5->value[3].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=
              ((mat<4,4,float,(glm::qualifier)0> *)this->T,fVar22 / fVar6);
    vVar14 = trans_1;
    pmVar5 = this->T;
    pmVar5->value[3].field_0 = trans_1.field_0;
    pmVar5->value[3].field_1 = trans_1.field_1;
    pmVar5->value[3].field_2 = trans_1.field_2;
    pmVar5->value[3].field_3 = trans_1.field_3;
    trans_1 = vVar14;
    markUpdated(this);
    requestRedraw();
    uVar23 = vmovlps_avx(auVar26);
    (this->dragPrevVec).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar23;
    (this->dragPrevVec).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         (int)((ulong)uVar23 >> 0x20);
  }
  (this->dragPrevVec).field_2 = local_1c8;
LAB_001fce46:
  return (bool)(bVar3 | this->currentlyDragging);
}

Assistant:

bool TransformationGizmo::interact() {
  if (!enabled.get()) return false;

  ImGuiIO& io = ImGui::GetIO();

  // end a drag, if needed
  bool draggingAtStart = currentlyDragging;
  if (currentlyDragging && (!ImGui::IsMouseDown(0) || !ImGui::IsMousePosValid())) {
    currentlyDragging = false;
  }

  // Get the mouse ray in world space
  glm::vec3 raySource = view::getCameraWorldPosition();
  glm::vec2 mouseCoords{io.MousePos.x, io.MousePos.y};
  glm::vec3 ray = view::screenCoordsToWorldRay(mouseCoords);

  // Get data about the widget
  // (there are much more efficient ways to do this)
  glm::vec3 center(T * glm::vec4{0., 0., 0., 1.});
  glm::vec3 nX(T * glm::vec4{1., 0., 0., 0.});
  glm::vec3 nY(T * glm::vec4{0., 1., 0., 0.});
  glm::vec3 nZ(T * glm::vec4{0., 0., 1., 0.});
  std::array<glm::vec3, 3> axNormals{glm::normalize(nX), glm::normalize(nY), glm::normalize(nZ)};

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSize = transScale * gizmoSizeRel * state::lengthScale;
  float diskRad = gizmoSize; // size 1
  float diskWidth = gizmoSize * diskWidthObj;

  if (currentlyDragging) {

    if (selectedType == TransformHandle::Rotation) {

      // Cast against the axis we are currently rotating
      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Compute the new nearest normal to the drag
        glm::vec3 nearestDir = glm::normalize(nearestPoint - center);
        float arg = glm::dot(normal, glm::cross(dragPrevVec, nearestDir));
        arg = glm::clamp(arg, -1.f, 1.f);
        float angle = std::asin(arg); // could be fancier with atan, but that's fine

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        // T.get() = glm::translate(glm::rotate(angle, normal) * glm::translate(T.get(), -trans), trans);
        T = glm::rotate(angle, normal) * T;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestDir; // store this dir for the next time around
      }
    } else if (selectedType == TransformHandle::Translation) {

      // Cast against the axis we are currently translating

      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) =
          lineTest(raySource, ray, center, normal, std::numeric_limits<float>::infinity());

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Split, transform, and recombine
        glm::vec3 trans = nearestPoint - dragPrevVec;
        T[3][0] += trans.x;
        T[3][1] += trans.y;
        T[3][2] += trans.z;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }

    } else if (selectedType == TransformHandle::Scale) {

      // Cast against the scale sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      float worldSphereRad = sphereRad * gizmoSize;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, worldSphereRad, false);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        float newWorldRad = glm::length(nearestPoint - center);
        float scaleRatio = newWorldRad / worldSphereRad;

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        T *= scaleRatio;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }
    }
  } else /* !currentlyDragging */ {

    // == Find the part of the widget that we are closest to

    float firstHit = std::numeric_limits<float>::infinity();
    float hitDist = std::numeric_limits<float>::infinity();
    int hitDim = -1;
    TransformHandle hitType = TransformHandle::None;
    glm::vec3 hitNearest(0., 0., 0.);

    // Test the three rotation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Rotation;
        hitNearest = nearestPoint;
      }
    }

    // Test the three translation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = lineTest(raySource, ray, center, normal, vecLength * gizmoSize);
      tHit -= diskWidth; // pull the hit outward, hackily simulates cylinder radius

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Translation;
        hitNearest = nearestPoint;
      }
    }

    { // Test the scaling sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, sphereRad * gizmoSize);

      if (dist == 0. && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = 0;
        hitType = TransformHandle::Scale;
        hitNearest = nearestPoint;
      }
    }

    // = Process the result

    // clear selection before proceeding
    selectedType = TransformHandle::None;
    selectedDim = -1;

    if (hitType == TransformHandle::Rotation && hitDist < diskWidth) {
      // rotation is hovered

      // set new selection
      selectedType = TransformHandle::Rotation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        glm::vec3 nearestDir = glm::normalize(hitNearest - center);
        dragPrevVec = nearestDir;
      }
    } else if (hitType == TransformHandle::Translation && hitDist < diskWidth) {
      // translation is hovered

      // set new selection
      selectedType = TransformHandle::Translation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    } else if (hitType == TransformHandle::Scale) {
      // scaling is hovered

      // set new selection
      selectedType = TransformHandle::Scale;
      selectedDim = -1;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    }
  }

  return currentlyDragging || draggingAtStart;
}